

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::OnAssertReturnCommand(CommandRunner *this,AssertReturnCommand *command)

{
  uint32_t uVar1;
  ExpectedValue expected_00;
  TypedValue actual_00;
  Index command_00;
  bool bVar2;
  Trap *this_00;
  undefined8 uVar3;
  size_type sVar4;
  size_type sVar5;
  ExpectedValue *pEVar6;
  reference pvVar7;
  reference pvVar8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  Enum local_bc;
  Enum local_b8;
  undefined4 uStack_b4;
  TypedValue actual;
  ExpectedValue *expected;
  size_t i;
  string local_88;
  undefined1 local_68 [8];
  ActionResult action_result;
  AssertReturnCommand *command_local;
  CommandRunner *this_local;
  Result result;
  
  action_result.trap.root_index_ = (Index)command;
  RunAction((ActionResult *)local_68,this,
            (command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line,&command->action,
            Quiet);
  bVar2 = wabt::interp::RefPtr::operator_cast_to_bool
                    ((RefPtr *)
                     &action_result.values.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    uVar1 = *(uint32_t *)(action_result.trap.root_index_ + 0xc);
    this_00 = wabt::interp::RefPtr<wabt::interp::Trap>::operator->
                        ((RefPtr<wabt::interp::Trap> *)
                         &action_result.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    wabt::interp::Trap::message_abi_cxx11_(&local_88,this_00);
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,uVar1,"unexpected trap: %s",uVar3);
    std::__cxx11::string::~string((string *)&local_88);
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar4 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                      ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                       &action_result.types.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    sVar5 = std::vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>::size
                      ((vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_> *)
                       (action_result.trap.root_index_ + 0x88));
    if (sVar4 == sVar5) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
      for (expected = (ExpectedValue *)0x0;
          pEVar6 = (ExpectedValue *)
                   std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                             ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                              &action_result.types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage), expected < pEVar6;
          expected = (ExpectedValue *)((long)&(expected->value).type.enum_ + 1)) {
        actual.value._8_8_ =
             std::vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>::
             operator[]((vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_> *
                        )(action_result.trap.root_index_ + 0x88),(size_type)expected);
        pvVar7 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                           ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_68,
                            (size_type)expected);
        local_b8 = pvVar7->enum_;
        pvVar8 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                           ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                            &action_result.types.
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(size_type)expected);
        command_00 = action_result.trap.root_index_;
        actual._0_8_ = pvVar8->i64_;
        actual.value.i64_ = *(undefined8 *)((pvVar8->v128_).v + 8);
        memcpy(&local_f0,(void *)actual.value._8_8_,0x30);
        actual_00._4_4_ = uStack_b4;
        actual_00.type.enum_ = local_b8;
        expected_00.value.value.i64_ = uStack_e8;
        expected_00.value._0_8_ = local_f0;
        expected_00.value.value._8_8_ = local_e0;
        expected_00.lane_type.enum_ = (undefined4)uStack_d8;
        expected_00.nan[0] = uStack_d8._4_4_;
        expected_00.nan[1] = (undefined4)local_d0;
        expected_00.nan[2] = local_d0._4_4_;
        expected_00._40_8_ = uStack_c8;
        actual_00.value.i64_ = actual._0_8_;
        actual_00.value._8_8_ = actual.value.i64_;
        local_bc = (Enum)CheckAssertReturnResult
                                   (this,(AssertReturnCommand *)command_00,(int)expected,expected_00
                                    ,actual_00,true);
        wabt::Result::operator|=((Result *)((long)&this_local + 4),(Result)local_bc);
      }
    }
    else {
      uVar1 = *(uint32_t *)(action_result.trap.root_index_ + 0xc);
      sVar4 = std::vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>::size
                        ((vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                          *)(action_result.trap.root_index_ + 0x88));
      sVar5 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                        ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                         &action_result.types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      PrintError(this,uVar1,"result length mismatch in assert_return: expected %zd, got %zd",sVar4,
                 sVar5);
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  ActionResult::~ActionResult((ActionResult *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::OnAssertReturnCommand(
    const AssertReturnCommand* command) {
  ActionResult action_result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);

  if (action_result.trap) {
    PrintError(command->line, "unexpected trap: %s",
               action_result.trap->message().c_str());
    return wabt::Result::Error;
  }

  if (action_result.values.size() != command->expected.size()) {
    PrintError(command->line,
               "result length mismatch in assert_return: expected %" PRIzd
               ", got %" PRIzd,
               command->expected.size(), action_result.values.size());
    return wabt::Result::Error;
  }

  wabt::Result result = wabt::Result::Ok;
  for (size_t i = 0; i < action_result.values.size(); ++i) {
    const ExpectedValue& expected = command->expected[i];
    TypedValue actual{action_result.types[i], action_result.values[i]};

    result |= CheckAssertReturnResult(command, i, expected, actual, true);
  }

  return result;
}